

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_parser_hlsl.h
# Opt level: O0

void yy_parse_failed(yyParser *yypParser)

{
  Context_conflict *ctx_00;
  Context_conflict *ctx;
  yyParser *yypParser_local;
  
  ctx_00 = yypParser->ctx;
  while (-1 < yypParser->yyidx) {
    yy_pop_parser_stack(yypParser);
  }
  fail(ctx_00,"Giving up. Parser is hopelessly lost...");
  yypParser->ctx = ctx_00;
  return;
}

Assistant:

static void yy_parse_failed(
  yyParser *yypParser           /* The parser */
){
  ParseHLSLARG_FETCH;
#if LEMON_SUPPORT_TRACING   /* __MOJOSHADER__ */
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sFail!\n",yyTracePrompt);
  }
#endif
  while( yypParser->yyidx>=0 ) yy_pop_parser_stack(yypParser);
  /* Here code is inserted which will be executed whenever the
  ** parser fails */
#line 42 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"

    // !!! FIXME: make this a proper fail() function.
    fail(ctx, "Giving up. Parser is hopelessly lost...");
#line 4061 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
  ParseHLSLARG_STORE; /* Suppress warning about unused %extra_argument variable */
}